

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

Node<KalahaState<(short)6>_> * __thiscall
MCTS::Node<KalahaState<(short)6>_>::add_child
          (Node<KalahaState<(short)6>_> *this,Move *move,KalahaState<(short)6> *state)

{
  short sVar1;
  short *psVar2;
  short *psVar3;
  Node<KalahaState<(short)6>_> *this_00;
  short *psVar4;
  Node<KalahaState<(short)6>_> *node;
  
  this_00 = (Node<KalahaState<(short)6>_> *)operator_new(0x60);
  Node(this_00,state,move,this);
  node = this_00;
  std::
  vector<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ::push_back(&this->children,&node);
  if ((this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->children).
      super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    assertion_failed("! children.empty()",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0xf2);
  }
  psVar2 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar1 = *move;
  psVar4 = psVar2;
  while( true ) {
    if (psVar4 == psVar3) {
      assertion_failed("itr != moves.end()",
                       "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                       ,0xf6);
    }
    if (*psVar4 == sVar1) break;
    psVar4 = psVar4 + 1;
  }
  *psVar4 = psVar3[-1];
  psVar3[-1] = sVar1;
  std::vector<short,_std::allocator<short>_>::resize
            (&this->moves,((long)psVar3 - (long)psVar2 >> 1) - 1);
  return node;
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}